

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LameWrapper.cpp
# Opt level: O0

int __thiscall cinemo::LameWrapper::init(LameWrapper *this,EVP_PKEY_CTX *ctx)

{
  WaveHeader *__p;
  LameWrapper *this_local;
  
  if ((this->initDone & 1U) == 0) {
    __p = wh::parseWaveHeader(&this->path);
    std::unique_ptr<cinemo::wh::WaveHeader,_std::default_delete<cinemo::wh::WaveHeader>_>::reset
              (&this->wh,__p);
    std::__cxx11::string::clear();
    this->initDone = true;
  }
  return (int)this;
}

Assistant:

void LameWrapper::init() {
		if (!initDone) {
			wh.reset(std::move(wh::parseWaveHeader(path)));
			message_buffer.clear();
			initDone = true;
		}
    }